

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Lexer_TestKeywords_Test::TestBody(Lexer_TestKeywords_Test *this)

{
  initializer_list<jsonnet::internal::Token> __l;
  initializer_list<jsonnet::internal::Token> __l_00;
  initializer_list<jsonnet::internal::Token> __l_01;
  initializer_list<jsonnet::internal::Token> __l_02;
  initializer_list<jsonnet::internal::Token> __l_03;
  initializer_list<jsonnet::internal::Token> __l_04;
  initializer_list<jsonnet::internal::Token> __l_05;
  initializer_list<jsonnet::internal::Token> __l_06;
  initializer_list<jsonnet::internal::Token> __l_07;
  initializer_list<jsonnet::internal::Token> __l_08;
  initializer_list<jsonnet::internal::Token> __l_09;
  initializer_list<jsonnet::internal::Token> __l_10;
  initializer_list<jsonnet::internal::Token> __l_11;
  initializer_list<jsonnet::internal::Token> __l_12;
  initializer_list<jsonnet::internal::Token> __l_13;
  initializer_list<jsonnet::internal::Token> __l_14;
  initializer_list<jsonnet::internal::Token> __l_15;
  initializer_list<jsonnet::internal::Token> __l_16;
  allocator<char> local_123;
  allocator_type local_122;
  allocator<char> local_121;
  _List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> local_120;
  string local_108;
  string local_e8;
  Token local_c8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"assert",&local_121);
  Token::Token(&local_c8,ASSERT,&local_e8);
  __l._M_len = 1;
  __l._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("assert","assert",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"else",&local_121);
  Token::Token(&local_c8,ELSE,&local_e8);
  __l_00._M_len = 1;
  __l_00._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_00,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("else","else",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"error",&local_121);
  Token::Token(&local_c8,ERROR,&local_e8);
  __l_01._M_len = 1;
  __l_01._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_01,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("error","error",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"false",&local_121);
  Token::Token(&local_c8,FALSE,&local_e8);
  __l_02._M_len = 1;
  __l_02._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_02,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("false","false",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"for",&local_121);
  Token::Token(&local_c8,FOR,&local_e8);
  __l_03._M_len = 1;
  __l_03._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_03,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("for","for",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"function",&local_121);
  Token::Token(&local_c8,FUNCTION,&local_e8);
  __l_04._M_len = 1;
  __l_04._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_04,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("function","function",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"if",&local_121);
  Token::Token(&local_c8,IF,&local_e8);
  __l_05._M_len = 1;
  __l_05._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_05,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("if","if",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"import",&local_121);
  Token::Token(&local_c8,IMPORT,&local_e8);
  __l_06._M_len = 1;
  __l_06._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_06,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("import","import",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"importstr",&local_121);
  Token::Token(&local_c8,IMPORTSTR,&local_e8);
  __l_07._M_len = 1;
  __l_07._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_07,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("importstr","importstr",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"importbin",&local_121);
  Token::Token(&local_c8,IMPORTBIN,&local_e8);
  __l_08._M_len = 1;
  __l_08._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_08,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("importbin","importbin",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"in",&local_121);
  Token::Token(&local_c8,IN,&local_e8);
  __l_09._M_len = 1;
  __l_09._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_09,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("in","in",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"local",&local_121);
  Token::Token(&local_c8,LOCAL,&local_e8);
  __l_10._M_len = 1;
  __l_10._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_10,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("local","local",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"null",&local_121);
  Token::Token(&local_c8,NULL_LIT,&local_e8);
  __l_11._M_len = 1;
  __l_11._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_11,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("null","null",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"self",&local_121);
  Token::Token(&local_c8,SELF,&local_e8);
  __l_12._M_len = 1;
  __l_12._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_12,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("self","self",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"super",&local_121);
  Token::Token(&local_c8,SUPER,&local_e8);
  __l_13._M_len = 1;
  __l_13._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_13,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("super","super",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"tailstrict",&local_121);
  Token::Token(&local_c8,TAILSTRICT,&local_e8);
  __l_14._M_len = 1;
  __l_14._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_14,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("tailstrict","tailstrict",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"then",&local_121);
  Token::Token(&local_c8,THEN,&local_e8);
  __l_15._M_len = 1;
  __l_15._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_15,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("then","then",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"true",&local_121);
  Token::Token(&local_c8,TRUE,&local_e8);
  __l_16._M_len = 1;
  __l_16._M_array = &local_c8;
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120
             ,__l_16,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_123);
  testLex("true","true",
          (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)&local_120,
          &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&local_120);
  Token::~Token(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

TEST(Lexer, TestKeywords)
{
    testLex("assert", "assert", {Token(Token::Kind::ASSERT, "assert")}, "");
    testLex("else", "else", {Token(Token::Kind::ELSE, "else")}, "");
    testLex("error", "error", {Token(Token::Kind::ERROR, "error")}, "");
    testLex("false", "false", {Token(Token::Kind::FALSE, "false")}, "");
    testLex("for", "for", {Token(Token::Kind::FOR, "for")}, "");
    testLex("function", "function", {Token(Token::Kind::FUNCTION, "function")}, "");
    testLex("if", "if", {Token(Token::Kind::IF, "if")}, "");
    testLex("import", "import", {Token(Token::Kind::IMPORT, "import")}, "");
    testLex("importstr", "importstr", {Token(Token::Kind::IMPORTSTR, "importstr")}, "");
    testLex("importbin", "importbin", {Token(Token::Kind::IMPORTBIN, "importbin")}, "");
    testLex("in", "in", {Token(Token::Kind::IN, "in")}, "");
    testLex("local", "local", {Token(Token::Kind::LOCAL, "local")}, "");
    testLex("null", "null", {Token(Token::Kind::NULL_LIT, "null")}, "");
    testLex("self", "self", {Token(Token::Kind::SELF, "self")}, "");
    testLex("super", "super", {Token(Token::Kind::SUPER, "super")}, "");
    testLex("tailstrict", "tailstrict", {Token(Token::Kind::TAILSTRICT, "tailstrict")}, "");
    testLex("then", "then", {Token(Token::Kind::THEN, "then")}, "");
    testLex("true", "true", {Token(Token::Kind::TRUE, "true")}, "");
}